

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O2

void tcg_gen_gvec_5_ptr_arm
               (TCGContext_conflict *tcg_ctx,uint32_t dofs,uint32_t aofs,uint32_t bofs,uint32_t cofs
               ,uint32_t eofs,TCGv_ptr ptr,uint32_t oprsz,uint32_t maxsz,int32_t data,
               gen_helper_gvec_5_ptr_conflict *fn)

{
  uint32_t val;
  TCGv_i32 pTVar1;
  TCGv_ptr ret;
  TCGv_ptr ret_00;
  TCGv_ptr ret_01;
  TCGv_ptr ret_02;
  TCGv_ptr ret_03;
  uintptr_t o_1;
  uintptr_t o_3;
  uintptr_t o_2;
  uintptr_t o;
  uintptr_t o_4;
  
  val = simd_desc_arm(oprsz,maxsz,data);
  pTVar1 = tcg_const_i32_arm(tcg_ctx,val);
  ret = tcg_temp_new_ptr(tcg_ctx);
  ret_00 = tcg_temp_new_ptr(tcg_ctx);
  ret_01 = tcg_temp_new_ptr(tcg_ctx);
  ret_02 = tcg_temp_new_ptr(tcg_ctx);
  ret_03 = tcg_temp_new_ptr(tcg_ctx);
  tcg_gen_addi_i64_arm(tcg_ctx,(TCGv_i64)ret,(TCGv_i64)tcg_ctx->cpu_env,(ulong)dofs);
  tcg_gen_addi_i64_arm(tcg_ctx,(TCGv_i64)ret_00,(TCGv_i64)tcg_ctx->cpu_env,(ulong)aofs);
  tcg_gen_addi_i64_arm(tcg_ctx,(TCGv_i64)ret_01,(TCGv_i64)tcg_ctx->cpu_env,(ulong)bofs);
  tcg_gen_addi_i64_arm(tcg_ctx,(TCGv_i64)ret_02,(TCGv_i64)tcg_ctx->cpu_env,(ulong)cofs);
  tcg_gen_addi_i64_arm(tcg_ctx,(TCGv_i64)ret_03,(TCGv_i64)tcg_ctx->cpu_env,(ulong)eofs);
  (*fn)(tcg_ctx,ret,ret_00,ret_01,ret_02,ret_03,ptr,pTVar1);
  tcg_temp_free_internal_arm(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  tcg_temp_free_internal_arm(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  tcg_temp_free_internal_arm(tcg_ctx,(TCGTemp *)(ret_01 + (long)tcg_ctx));
  tcg_temp_free_internal_arm(tcg_ctx,(TCGTemp *)(ret_02 + (long)tcg_ctx));
  tcg_temp_free_internal_arm(tcg_ctx,(TCGTemp *)(ret_03 + (long)tcg_ctx));
  tcg_temp_free_internal_arm(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
  return;
}

Assistant:

void tcg_gen_gvec_5_ptr(TCGContext *tcg_ctx, uint32_t dofs, uint32_t aofs, uint32_t bofs,
                        uint32_t cofs, uint32_t eofs, TCGv_ptr ptr,
                        uint32_t oprsz, uint32_t maxsz, int32_t data,
                        gen_helper_gvec_5_ptr *fn)
{
    TCGv_ptr a0, a1, a2, a3, a4;
    TCGv_i32 desc = tcg_const_i32(tcg_ctx, simd_desc(oprsz, maxsz, data));

    a0 = tcg_temp_new_ptr(tcg_ctx);
    a1 = tcg_temp_new_ptr(tcg_ctx);
    a2 = tcg_temp_new_ptr(tcg_ctx);
    a3 = tcg_temp_new_ptr(tcg_ctx);
    a4 = tcg_temp_new_ptr(tcg_ctx);

    tcg_gen_addi_ptr(tcg_ctx, a0, tcg_ctx->cpu_env, dofs);
    tcg_gen_addi_ptr(tcg_ctx, a1, tcg_ctx->cpu_env, aofs);
    tcg_gen_addi_ptr(tcg_ctx, a2, tcg_ctx->cpu_env, bofs);
    tcg_gen_addi_ptr(tcg_ctx, a3, tcg_ctx->cpu_env, cofs);
    tcg_gen_addi_ptr(tcg_ctx, a4, tcg_ctx->cpu_env, eofs);

    fn(tcg_ctx, a0, a1, a2, a3, a4, ptr, desc);

    tcg_temp_free_ptr(tcg_ctx, a0);
    tcg_temp_free_ptr(tcg_ctx, a1);
    tcg_temp_free_ptr(tcg_ctx, a2);
    tcg_temp_free_ptr(tcg_ctx, a3);
    tcg_temp_free_ptr(tcg_ctx, a4);
    tcg_temp_free_i32(tcg_ctx, desc);
}